

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O0

CloningFilter * anon_unknown.dwarf_88686::getCloningFilter(HelicsFilter filt,HelicsError *err)

{
  FilterObject *pFVar1;
  HelicsError *in_RSI;
  FilterObject *fObj;
  HelicsError *in_stack_ffffffffffffffd0;
  HelicsFilter in_stack_ffffffffffffffd8;
  CloningFilter *local_8;
  
  pFVar1 = getFilterObj(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  if (pFVar1 == (FilterObject *)0x0) {
    local_8 = (CloningFilter *)0x0;
  }
  else if ((pFVar1->cloning & 1U) == 0) {
    assignError(in_RSI,-3,"filter must be a cloning filter");
    local_8 = (CloningFilter *)0x0;
  }
  else if (pFVar1->filtPtr == (Filter *)0x0) {
    local_8 = (CloningFilter *)0x0;
  }
  else {
    local_8 = (CloningFilter *)
              __dynamic_cast(pFVar1->filtPtr,&helics::Filter::typeinfo,
                             &helics::CloningFilter::typeinfo,0);
  }
  return local_8;
}

Assistant:

helics::CloningFilter* getCloningFilter(HelicsFilter filt, HelicsError* err)
{
    auto* fObj = getFilterObj(filt, err);
    if (fObj == nullptr) {
        return nullptr;
    }
    if (!fObj->cloning) {
        static constexpr char nonCloningFilterString[] = "filter must be a cloning filter";
        assignError(err, HELICS_ERROR_INVALID_OBJECT, nonCloningFilterString);
        return nullptr;
    }
    return dynamic_cast<helics::CloningFilter*>(fObj->filtPtr);
}